

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_handler.cpp
# Opt level: O2

spv_result_t __thiscall
spvtools::AssemblyContext::binaryEncodeNumericLiteral
          (AssemblyContext *this,char *val,spv_result_t error_code,IdType *type,
          spv_instruction_t *pInst)

{
  uint32_t uVar1;
  EncodeNumberStatus EVar2;
  char *pcVar3;
  NumberType local_250;
  string error_msg;
  _Any_data local_228;
  code *local_218;
  code *local_210;
  DiagnosticStream local_208;
  
  switch(type->type_class) {
  case kBottom:
    uVar1 = assumedBitWidth(type);
    pcVar3 = strchr(val,0x2e);
    local_250.bitwidth = uVar1;
    if (pcVar3 != (char *)0x0) goto LAB_00252c9a;
    if ((type->isSigned == false) && (*val != '-')) goto LAB_00252ceb;
LAB_00252d0c:
    local_250.kind = SPV_NUMBER_SIGNED_INT;
    break;
  case kScalarIntegerType:
    local_250.bitwidth = type->bitwidth;
    if (type->isSigned == true) goto LAB_00252d0c;
LAB_00252ceb:
    local_250.kind = SPV_NUMBER_UNSIGNED_INT;
    break;
  case kScalarFloatType:
    local_250.bitwidth = type->bitwidth;
LAB_00252c9a:
    local_250.kind = SPV_NUMBER_FLOATING;
    break;
  case kOtherType:
    diagnostic(&local_208,this,SPV_ERROR_INTERNAL);
    std::operator<<((ostream *)&local_208,"Unexpected numeric literal type");
    DiagnosticStream::~DiagnosticStream(&local_208);
    return local_208.error_;
  }
  error_msg._M_dataplus._M_p = (pointer)&error_msg.field_2;
  error_msg._M_string_length = 0;
  error_msg.field_2._M_local_buf[0] = '\0';
  local_210 = std::
              _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/text_handler.cpp:282:7)>
              ::_M_invoke;
  local_218 = std::
              _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/text_handler.cpp:282:7)>
              ::_M_manager;
  local_228._M_unused._M_object = this;
  local_228._8_8_ = pInst;
  EVar2 = utils::ParseAndEncodeNumber
                    (val,&local_250,(function<void_(unsigned_int)> *)&local_228,&error_msg);
  if (local_218 != (code *)0x0) {
    (*local_218)(&local_228,&local_228,__destroy_functor);
  }
  switch(EVar2) {
  case kSuccess:
    goto switchD_00252d91_caseD_0;
  case kUnsupported:
    error_code = SPV_ERROR_INTERNAL;
    break;
  case kInvalidUsage:
    error_code = SPV_ERROR_INVALID_TEXT;
    break;
  case kInvalidText:
    break;
  default:
    diagnostic(&local_208,this,SPV_ERROR_INTERNAL);
    std::operator<<((ostream *)&local_208,"Unexpected result code from ParseAndEncodeNumber()");
    goto LAB_00252def;
  }
  diagnostic(&local_208,this,error_code);
  std::operator<<((ostream *)&local_208,(string *)&error_msg);
LAB_00252def:
  DiagnosticStream::~DiagnosticStream(&local_208);
  EVar2 = local_208.error_;
switchD_00252d91_caseD_0:
  std::__cxx11::string::_M_dispose();
  return EVar2;
}

Assistant:

spv_result_t AssemblyContext::binaryEncodeNumericLiteral(
    const char* val, spv_result_t error_code, const IdType& type,
    spv_instruction_t* pInst) {
  using spvtools::utils::EncodeNumberStatus;
  // Populate the NumberType from the IdType for parsing.
  spvtools::utils::NumberType number_type;
  switch (type.type_class) {
    case IdTypeClass::kOtherType:
      return diagnostic(SPV_ERROR_INTERNAL)
             << "Unexpected numeric literal type";
    case IdTypeClass::kScalarIntegerType:
      if (type.isSigned) {
        number_type = {type.bitwidth, SPV_NUMBER_SIGNED_INT};
      } else {
        number_type = {type.bitwidth, SPV_NUMBER_UNSIGNED_INT};
      }
      break;
    case IdTypeClass::kScalarFloatType:
      number_type = {type.bitwidth, SPV_NUMBER_FLOATING};
      break;
    case IdTypeClass::kBottom:
      // kBottom means the type is unknown and we need to infer the type before
      // parsing the number. The rule is: If there is a decimal point, treat
      // the value as a floating point value, otherwise a integer value, then
      // if the first char of the integer text is '-', treat the integer as a
      // signed integer, otherwise an unsigned integer.
      uint32_t bitwidth = static_cast<uint32_t>(assumedBitWidth(type));
      if (strchr(val, '.')) {
        number_type = {bitwidth, SPV_NUMBER_FLOATING};
      } else if (type.isSigned || val[0] == '-') {
        number_type = {bitwidth, SPV_NUMBER_SIGNED_INT};
      } else {
        number_type = {bitwidth, SPV_NUMBER_UNSIGNED_INT};
      }
      break;
  }

  std::string error_msg;
  EncodeNumberStatus parse_status = ParseAndEncodeNumber(
      val, number_type,
      [this, pInst](uint32_t d) { this->binaryEncodeU32(d, pInst); },
      &error_msg);
  switch (parse_status) {
    case EncodeNumberStatus::kSuccess:
      return SPV_SUCCESS;
    case EncodeNumberStatus::kInvalidText:
      return diagnostic(error_code) << error_msg;
    case EncodeNumberStatus::kUnsupported:
      return diagnostic(SPV_ERROR_INTERNAL) << error_msg;
    case EncodeNumberStatus::kInvalidUsage:
      return diagnostic(SPV_ERROR_INVALID_TEXT) << error_msg;
  }
  // This line is not reachable, only added to satisfy the compiler.
  return diagnostic(SPV_ERROR_INTERNAL)
         << "Unexpected result code from ParseAndEncodeNumber()";
}